

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Abc_Obj_t * Abc_NodeFromMap_rec(Abc_Ntk_t *pNtkNew,Map_Node_t *pNodeMap,int fPhase)

{
  int iVar1;
  Map_Cut_t *pMVar2;
  Abc_Obj_t *pFanin;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar3;
  Abc_Ntk_t *local_40;
  Abc_Obj_t *pNodeInv;
  Abc_Obj_t *pNodeNew;
  int fPhase_local;
  Map_Node_t *pNodeMap_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Map_NodeIsConst(pNodeMap);
  if (iVar1 == 0) {
    pNtkNew_local = (Abc_Ntk_t *)Map_NodeReadData(pNodeMap,fPhase);
    if (pNtkNew_local == (Abc_Ntk_t *)0x0) {
      pMVar2 = Map_NodeReadCutBest(pNodeMap,fPhase);
      if (pMVar2 == (Map_Cut_t *)0x0) {
        pMVar2 = Map_NodeReadCutBest(pNodeMap,(uint)((fPhase != 0 ^ 0xffU) & 1));
        if ((pMVar2 == (Map_Cut_t *)0x0) && (iVar1 = Map_NodeIsConst(pNodeMap), iVar1 == 0)) {
          __assert_fail("Map_NodeReadCutBest(pNodeMap, !fPhase) != NULL || Map_NodeIsConst(pNodeMap)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                        ,0x1cb,"Abc_Obj_t *Abc_NodeFromMap_rec(Abc_Ntk_t *, Map_Node_t *, int)");
        }
        pFanin = Abc_NodeFromMapPhase_rec(pNtkNew,pNodeMap,(uint)((fPhase != 0 ^ 0xffU) & 1));
        pNtkNew_local = (Abc_Ntk_t *)Abc_NtkCreateNode(pNtkNew);
        Abc_ObjAddFanin((Abc_Obj_t *)pNtkNew_local,pFanin);
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        pMVar3 = Mio_LibraryReadInv(pLib);
        ((anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pNtkNew_local->vCis)->pData = pMVar3;
        Map_NodeSetData(pNodeMap,fPhase,(char *)pNtkNew_local);
      }
      else {
        pNtkNew_local = (Abc_Ntk_t *)Abc_NodeFromMapPhase_rec(pNtkNew,pNodeMap,fPhase);
      }
    }
  }
  else {
    if (fPhase == 0) {
      local_40 = (Abc_Ntk_t *)Abc_NtkCreateNodeConst0(pNtkNew);
    }
    else {
      local_40 = (Abc_Ntk_t *)Abc_NtkCreateNodeConst1(pNtkNew);
    }
    if (((anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&local_40->vCis)->pData == (void *)0x0) {
      printf("Error creating mapped network: Library does not have a constant %d gate.\n",
             (ulong)(uint)fPhase);
    }
    pNtkNew_local = local_40;
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NodeFromMap_rec( Abc_Ntk_t * pNtkNew, Map_Node_t * pNodeMap, int fPhase )
{
    Abc_Obj_t * pNodeNew, * pNodeInv;

    // check the case of constant node
    if ( Map_NodeIsConst(pNodeMap) )
    {
        pNodeNew = fPhase? Abc_NtkCreateNodeConst1(pNtkNew) : Abc_NtkCreateNodeConst0(pNtkNew);
        if ( pNodeNew->pData == NULL )
            printf( "Error creating mapped network: Library does not have a constant %d gate.\n", fPhase );
        return pNodeNew;
    }

    // check if the phase is already implemented
    pNodeNew = (Abc_Obj_t *)Map_NodeReadData( pNodeMap, fPhase );
    if ( pNodeNew )
        return pNodeNew;

    // implement the node if the best cut is assigned
    if ( Map_NodeReadCutBest(pNodeMap, fPhase) != NULL )
        return Abc_NodeFromMapPhase_rec( pNtkNew, pNodeMap, fPhase );

    // if the cut is not assigned, implement the node
    assert( Map_NodeReadCutBest(pNodeMap, !fPhase) != NULL || Map_NodeIsConst(pNodeMap) );
    pNodeNew = Abc_NodeFromMapPhase_rec( pNtkNew, pNodeMap, !fPhase );

    // add the inverter
    pNodeInv = Abc_NtkCreateNode( pNtkNew );
    Abc_ObjAddFanin( pNodeInv, pNodeNew );
    pNodeInv->pData = Mio_LibraryReadInv((Mio_Library_t *)Abc_FrameReadLibGen());

    // set the inverter
    Map_NodeSetData( pNodeMap, fPhase, (char *)pNodeInv );
    return pNodeInv;
}